

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  long lVar1;
  Rep *pRVar2;
  char *pcVar3;
  FilterBlockReader *this_00;
  long in_FS_OFFSET;
  long local_70;
  ReadOptions opt;
  BlockHandle filter_handle;
  Slice v;
  BlockContents block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  filter_handle.offset_._0_4_ = 0xffffffff;
  filter_handle.offset_._4_4_ = 0xffffffff;
  filter_handle.size_._0_4_ = 0xffffffff;
  filter_handle.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&block,(Slice *)&filter_handle);
  pcVar3 = block.data.data_;
  Status::~Status((Status *)&block);
  if (pcVar3 == (char *)0x0) {
    opt.verify_checksums = false;
    opt.fill_cache = true;
    opt.snapshot = (Snapshot *)0x0;
    if ((this->rep_->options).paranoid_checks == true) {
      opt.verify_checksums = true;
      opt.fill_cache = true;
    }
    block.data.data_ = "";
    block.data.size_ = 0;
    ReadBlock((leveldb *)&local_70,this->rep_->file,&opt,&filter_handle,&block);
    Status::~Status((Status *)&local_70);
    if (local_70 == 0) {
      pRVar2 = this->rep_;
      if (block.heap_allocated == true) {
        pRVar2->filter_data = block.data.data_;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader(this_00,(pRVar2->options).filter_policy,&block.data);
      this->rep_->filter = this_00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}